

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

value * __thiscall
mjs::anon_unknown_35::decode_uri
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  value *pvVar1;
  uint uVar2;
  conversion_result cVar3;
  wostream *pwVar4;
  wchar_t *pwVar5;
  size_type __rlen;
  wchar_t *pwVar6;
  ulong uVar7;
  gc_heap_ptr<mjs::global_object> *pgVar8;
  gc_heap_ptr<mjs::global_object> *pgVar9;
  ulong uVar10;
  uint8_t buf [4];
  wstring res;
  wchar_t buf16 [2];
  wostringstream woss;
  wostringstream _woss;
  wchar_t *local_3a8;
  long local_3a0;
  long local_398 [2];
  uchar local_384 [4];
  anon_unknown_35 *local_380;
  uint local_374;
  wchar_t *local_370;
  ulong local_368;
  wchar_t local_360;
  undefined4 uStack_35c;
  value *local_350;
  wchar_t *local_348;
  wchar_t *local_340;
  wstring_view local_338;
  wchar_t local_328 [2];
  gc_heap_ptr_untyped local_320 [23];
  wstring_view local_1a8 [23];
  
  pwVar5 = (wchar_t *)s._M_len;
  local_370 = &local_360;
  local_368 = 0;
  local_360 = L'\0';
  local_380 = this;
  local_350 = __return_storage_ptr__;
  if (global != (gc_heap_ptr<mjs::global_object> *)0x0) {
    local_340 = pwVar5 + 1;
    local_348 = pwVar5 + 3;
    pgVar9 = (gc_heap_ptr<mjs::global_object> *)0x0;
    do {
      if (pwVar5[(long)pgVar9] == L'%') {
        pgVar8 = (gc_heap_ptr<mjs::global_object> *)
                 ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + 3);
        if (global < pgVar8) {
          anon_unknown_5::throw_uri_error((gc_heap_ptr<mjs::global_object> *)local_380);
        }
        uVar2 = get_hex_value2(local_340 + (long)pgVar9);
        local_384[0] = (uchar)uVar2;
        local_384[3] = 0;
        local_384[1] = '\0';
        local_384[2] = '\0';
        local_374 = 1;
        if ((((char)local_384[0] < '\0') && (local_374 = 2, (uVar2 & 0xe0) != 0xc0)) &&
           (local_374 = 3, (uVar2 & 0xf0) != 0xe0)) {
          local_374 = (uint)((uVar2 & 0xf8) == 0xf0) << 2;
        }
        if (local_374 != 1) {
          if (local_374 == 0) {
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
            pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                      (pwVar4,pwVar5 + (long)pgVar8,(long)global - (long)pgVar8);
            std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
            pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
            std::__cxx11::wstringbuf::str();
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3a8,local_3a0);
            if (local_3a8 != (wchar_t *)local_398) {
              operator_delete(local_3a8,local_398[0] * 4 + 4);
            }
            std::__cxx11::wstringbuf::str();
            throw_runtime_error(&local_338,
                                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                                ,0xe9);
          }
          uVar7 = (ulong)local_374;
          pwVar6 = local_348 + (long)pgVar9;
          uVar10 = 1;
          do {
            if (pwVar5[(long)pgVar8] != L'%') {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
              pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
              if (global < pgVar8) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",pgVar8,global);
              }
              std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                        (pwVar4,pwVar6,(long)global - (long)pgVar8);
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
              pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
              std::__cxx11::wstringbuf::str();
              std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3a8,local_3a0);
              if (local_3a8 != (wchar_t *)local_398) {
                operator_delete(local_3a8,local_398[0] * 4 + 4);
              }
              std::__cxx11::wstringbuf::str();
              throw_runtime_error(&local_338,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                                  ,0xf0);
            }
            pgVar8 = (gc_heap_ptr<mjs::global_object> *)
                     ((long)&(pgVar8->super_gc_heap_ptr_untyped).heap_ + 3);
            if (global < pgVar8) {
              anon_unknown_5::throw_uri_error((gc_heap_ptr<mjs::global_object> *)local_380);
            }
            uVar2 = get_hex_value2(pwVar6 + 1);
            local_384[uVar10] = (uchar)uVar2;
            uVar10 = uVar10 + 1;
            pwVar6 = pwVar6 + 3;
          } while (uVar7 != uVar10);
        }
        uVar2 = local_374;
        cVar3 = unicode::utf8_to_utf32<unsigned_char>(local_384,local_374);
        if (uVar2 != cVar3.length) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
          pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,pwVar5,(long)global);
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
          pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
          std::__cxx11::wstringbuf::str();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3a8,local_3a0);
          if (local_3a8 != (wchar_t *)local_398) {
            operator_delete(local_3a8,local_398[0] * 4 + 4);
          }
          std::__cxx11::wstringbuf::str();
          throw_runtime_error(&local_338,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                              ,0xf8);
        }
        uVar2 = unicode::utf32_to_utf16<wchar_t>(cVar3.code_point,local_328);
        if (2 < uVar2) {
          __assert_fail("len16 <= sizeof(buf16)/sizeof(*buf16)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                        ,0xfc,
                        "value mjs::(anonymous namespace)::decode_uri(const gc_heap_ptr<global_object> &, const std::wstring_view)"
                       );
        }
        if (uVar2 == 0) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_320);
          pwVar4 = std::operator<<((wostream *)local_320,"Unsupported: ");
          if (global < pgVar8) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",pgVar8,global);
          }
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (pwVar4,pwVar5 + (long)pgVar8,(long)global - (long)pgVar8);
          std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
          pwVar4 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
          std::__cxx11::wstringbuf::str();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar4,local_3a8,local_3a0);
          if (local_3a8 != (wchar_t *)local_398) {
            operator_delete(local_3a8,local_398[0] * 4 + 4);
          }
          std::__cxx11::wstringbuf::str();
          throw_runtime_error(&local_338,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                              ,0x100);
        }
        std::__cxx11::wstring::replace((ulong)&local_370,local_368,(wchar_t *)0x0,(ulong)local_328);
      }
      else {
        std::__cxx11::wstring::push_back((wchar_t)&local_370);
        pgVar8 = (gc_heap_ptr<mjs::global_object> *)
                 ((long)&(pgVar9->super_gc_heap_ptr_untyped).heap_ + 1);
      }
      pgVar9 = pgVar8;
    } while (pgVar8 < global);
  }
  local_1a8[0]._M_len = local_368;
  local_1a8[0]._M_str = local_370;
  string::string((string *)local_320,*(gc_heap **)local_380,local_1a8);
  pvVar1 = local_350;
  local_350->type_ = string;
  (local_350->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_320[0].heap_;
  *(uint32_t *)((long)&local_350->field_1 + 8) = local_320[0].pos_;
  if (local_320[0].heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_320[0].heap_,(gc_heap_ptr_untyped *)&(local_350->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_320);
  if (local_370 != &local_360) {
    operator_delete(local_370,CONCAT44(uStack_35c,local_360) * 4 + 4);
  }
  return pvVar1;
}

Assistant:

value decode_uri(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wstring res;
    for (size_t i = 0; i < s.length();) {
        if (s[i] != '%') {
            res += s[i];
            ++i;
            continue;
        }
       auto get_byte = [&] () {
            assert(s[i] == '%');
            ++i;
            if (i + 2 > s.length()) {
                throw_uri_error(global);
            }
            i += 2;
            return static_cast<uint8_t>(get_hex_value2(&s[i-2]));
       };
       uint8_t buf[4] = { get_byte(), };
       const auto len = unicode::utf8_length_from_lead_code_unit(buf[0]);
       if (!len) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       assert(len <= sizeof(buf));
       for (unsigned j = 1; j < len; ++j) {
           if (s[i] != '%') {
               std::wostringstream woss;
               woss << "Unsupported: " << s.substr(i);
               NOT_IMPLEMENTED(woss.str());
           }
           buf[j] = get_byte();
       }
       auto conv = unicode::utf8_to_utf32(buf, len);
       if (conv.length != len) {
            std::wostringstream woss;
            woss << "Unsupported: " << s;
            NOT_IMPLEMENTED(woss.str());
        }
       wchar_t buf16[unicode::utf16_max_length];
       const auto len16 = unicode::utf32_to_utf16(conv.code_point, buf16);
       assert(len16 <= sizeof(buf16)/sizeof(*buf16));
       if (len16 == unicode::invalid_length) {
           std::wostringstream woss;
           woss << "Unsupported: " << s.substr(i);
           NOT_IMPLEMENTED(woss.str());
       }
       res.insert(res.end(), buf16, buf16 + len16);
    }
    return value{string{global.heap(), res}};
}